

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O3

shared_ptr<unsigned_char> __thiscall
anon_unknown.dwarf_2f8390::Region::make_array(Region *this,size_t size)

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar2;
  
  pp_Var1 = (_func_int **)operator_new__(size);
  (this->super_Test)._vptr_Test = pp_Var1;
  (this->super_Test).gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (GTestFlagSaver *)operator_new(0x18);
  ((sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->color_)._M_dataplus
  ._M_p = (pointer)0x100000001;
  *(undefined ***)sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &PTR___Sp_counted_base_0026fa00;
  ((sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->color_).
  _M_string_length = (size_type)pp_Var1;
  (this->super_Test).gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  return (shared_ptr<unsigned_char>)
         sVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::uint8_t> make_array (std::size_t size) {
            return std::shared_ptr<std::uint8_t>{new std::uint8_t[size],
                                                 [] (std::uint8_t * p) { delete[] p; }};
        }